

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

void __thiscall xmrig::Api::exec(Api *this,IApiRequest *request)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *this_00;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_01;
  reference ppIVar4;
  ulong uVar5;
  long *in_RSI;
  undefined8 uVar6;
  long in_RDI;
  IApiListener *listener;
  iterator __end1;
  iterator __begin1;
  vector<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_> *__range1;
  Value features;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  vector<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_> *in_stack_fffffffffffffe48;
  GenericStringRef<char> *in_stack_fffffffffffffe50;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_fffffffffffffe60;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_01;
  StringRefType *in_stack_fffffffffffffe68;
  GenericStringRef<char> *this_02;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffe70;
  GenericStringRef<char> *this_03;
  GenericStringRef<char> *this_04;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_fffffffffffffea8;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_02;
  StringRefType *in_stack_fffffffffffffeb0;
  StringRefType *in_stack_fffffffffffffeb8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffec0;
  __normal_iterator<xmrig::IApiListener_**,_std::vector<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>_>
  local_108;
  long local_100;
  GenericStringRef<char> local_f8;
  undefined1 local_e8 [32];
  GenericStringRef<char> local_c8;
  GenericStringRef<char> local_b8 [2];
  GenericStringRef<char> local_98;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_88;
  GenericStringRef<char> local_78;
  GenericStringRef<char> local_68;
  undefined1 local_58 [48];
  GenericStringRef<char> local_28;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_18;
  long *local_10;
  
  local_10 = in_RSI;
  iVar3 = (**(code **)(*in_RSI + 0x70))();
  if (iVar3 == 1) {
    this_00 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               *)(**(code **)(*local_10 + 0x60))();
    local_18 = rapidjson::
               GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               ::GetAllocator(this_00);
    (**(code **)(*local_10 + 0x10))();
    (**(code **)(*local_10 + 0x68))();
    rapidjson::GenericStringRef<char>::GenericStringRef<3u>(&local_28,(char (*) [3])0x2790a3);
    rapidjson::StringRef<char>((char *)in_stack_fffffffffffffe48);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
              in_stack_fffffffffffffea8);
    allocator_00 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)(**(code **)(*local_10 + 0x68))()
    ;
    this_04 = (GenericStringRef<char> *)(local_58 + 0x10);
    rapidjson::GenericStringRef<char>::GenericStringRef<10u>(this_04,(char (*) [10])"worker_id");
    allocator_02 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)local_58;
    rapidjson::StringRef<char>((char *)in_stack_fffffffffffffe48);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
              allocator_02);
    this_01 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)(**(code **)(*local_10 + 0x68))();
    rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_68,(char (*) [7])"uptime");
    Chrono::currentMSecsSinceEpoch();
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_long>
              (this_01,(StringRefType *)allocator_02,(unsigned_long)this_04,allocator_00);
    (**(code **)(*local_10 + 0x68))();
    rapidjson::GenericStringRef<char>::GenericStringRef<11u>(&local_78,(char (*) [11])0x27915d);
    (**(code **)(*local_10 + 0x30))();
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<bool>(this_01,(StringRefType *)allocator_02,SUB81((ulong)this_04 >> 0x38,0),
                    allocator_00);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)in_stack_fffffffffffffe50,(Type)((ulong)in_stack_fffffffffffffe48 >> 0x20));
    rapidjson::GenericStringRef<char>::GenericStringRef<4u>(&local_98,(char (*) [4])"api");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    rapidjson::GenericStringRef<char>::GenericStringRef<5u>(local_b8,(char (*) [5])"http");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    this_03 = &local_c8;
    rapidjson::GenericStringRef<char>::GenericStringRef<6u>(this_03,(char (*) [6])"hwloc");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this_03,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    this_02 = (GenericStringRef<char> *)(local_e8 + 0x10);
    rapidjson::GenericStringRef<char>::GenericStringRef<4u>(this_02,(char (*) [4])"tls");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this_03,this_02,in_stack_fffffffffffffe60);
    allocator_01 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)local_e8;
    rapidjson::GenericStringRef<char>::GenericStringRef<7u>
              ((GenericStringRef<char> *)allocator_01,(char (*) [7])"opencl");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this_03,this_02,allocator_01);
    (**(code **)(*local_10 + 0x68))();
    in_stack_fffffffffffffe50 = &local_f8;
    rapidjson::GenericStringRef<char>::GenericStringRef<9u>
              (in_stack_fffffffffffffe50,(char (*) [9])"features");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(this_01,(StringRefType *)allocator_02,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this_04,allocator_00);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_88);
  }
  local_100 = in_RDI + 0xc0;
  local_108._M_current =
       (IApiListener **)
       std::vector<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>::begin
                 (in_stack_fffffffffffffe48);
  std::vector<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>::end
            (in_stack_fffffffffffffe48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<xmrig::IApiListener_**,_std::vector<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>_>
                        *)in_stack_fffffffffffffe50,
                       (__normal_iterator<xmrig::IApiListener_**,_std::vector<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>_>
                        *)in_stack_fffffffffffffe48);
    if (!bVar1) {
      bVar2 = (**(code **)(*local_10 + 0x28))();
      uVar6 = 200;
      if ((bVar2 & 1) != 0) {
        uVar6 = 0x194;
      }
      (**(code **)(*local_10 + 0x80))(local_10,uVar6);
      return;
    }
    ppIVar4 = __gnu_cxx::
              __normal_iterator<xmrig::IApiListener_**,_std::vector<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>_>
              ::operator*(&local_108);
    (*(*ppIVar4)->_vptr_IApiListener[2])(*ppIVar4,local_10);
    uVar5 = (**(code **)(*local_10 + 0x20))();
    if ((uVar5 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<xmrig::IApiListener_**,_std::vector<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>_>
    ::operator++(&local_108);
  }
  return;
}

Assistant:

void xmrig::Api::exec(IApiRequest &request)
{
    using namespace rapidjson;

    if (request.type() == IApiRequest::REQ_SUMMARY) {
        auto &allocator = request.doc().GetAllocator();

        request.accept();
        request.reply().AddMember("id",         StringRef(m_id),       allocator);
        request.reply().AddMember("worker_id",  StringRef(m_workerId), allocator);
        request.reply().AddMember("uptime",     (Chrono::currentMSecsSinceEpoch() - m_timestamp) / 1000, allocator);
        request.reply().AddMember("restricted", request.isRestricted(), allocator);

        Value features(kArrayType);
#       ifdef XMRIG_FEATURE_API
        features.PushBack("api", allocator);
#       endif
#       ifdef XMRIG_FEATURE_HTTP
        features.PushBack("http", allocator);
#       endif
#       ifdef XMRIG_FEATURE_LIBCPUID
        features.PushBack("cpuid", allocator);
#       endif
#       ifdef XMRIG_FEATURE_HWLOC
        features.PushBack("hwloc", allocator);
#       endif
#       ifdef XMRIG_FEATURE_TLS
        features.PushBack("tls", allocator);
#       endif
#       ifdef XMRIG_FEATURE_OPENCL
        features.PushBack("opencl", allocator);
#       endif
        request.reply().AddMember("features", features, allocator);
    }

    for (IApiListener *listener : m_listeners) {
        listener->onRequest(request);

        if (request.isDone()) {
            return;
        }
    }

    request.done(request.isNew() ? HTTP_STATUS_NOT_FOUND : HTTP_STATUS_OK);
}